

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O0

long dd_lk(long *prt,long n,double key)

{
  long lVar1;
  double v;
  double u;
  long k;
  long i;
  long h;
  double kz;
  double km;
  long hgh;
  long md;
  long lw;
  double key_local;
  long n_local;
  long *prt_local;
  long local_8;
  
  if (n == 1) {
    local_8 = 0;
  }
  else if (n < 6) {
    k = 0;
    km = key - (double)*prt;
    if (km < 0.0) {
      km = -km;
    }
    for (i = 1; i < n; i = i + 1) {
      kz = key - (double)prt[i];
      if (kz < 0.0) {
        kz = -kz;
      }
      if (kz < km) {
        km = kz;
        k = i;
      }
    }
    local_8 = k;
  }
  else {
    lw = 0;
    hgh = n + -1;
    if (hgh == 0) {
      local_8 = 0;
    }
    else {
      do {
        lVar1 = (lw + hgh) / 2;
        if ((double)prt[lVar1] < key) {
          lw = lVar1 + 1;
          lVar1 = hgh;
        }
        hgh = lVar1;
      } while (lw < hgh);
      u = key - (double)prt[lw];
      if (u < 0.0) {
        u = -u;
      }
      h = lw;
      if (0 < lw) {
        v = key - (double)prt[lw + -1];
        if (v < 0.0) {
          v = -v;
        }
        if (v < u) {
          u = v;
          h = lw + -1;
        }
      }
      if (lw < n + -1) {
        v = key - (double)prt[lw + 1];
        if (v < 0.0) {
          v = -v;
        }
        if (v < u) {
          h = lw + 1;
        }
      }
      local_8 = h;
    }
  }
  return local_8;
}

Assistant:

long dd_lk(long *prt, long n, double key)
      {
      long lw, md, hgh;
      double km,kz;
      long h, i;
      long k;
      double u, v;

      if(n==1) return 0 ;
      if(n<=5) {
        k = 0 ;
        km = key-prt[0]; if(km<0.0) km = -km;
        for(i=1;i<n;i++) {
           kz = key-prt[i]; if(kz<0.0) kz = -kz;
           if(kz<km) {
              km = kz ;
              k = i ;
           }
        }
        return k ;
      }
      lw = 0; hgh=n-1;

      if(lw==hgh) {
         return lw;
      }
      do {
         md = (lw+hgh)/2;
         if(key>prt[md]) {
            lw = md+1;
         } else {
            hgh = md;
         }
      } while (lw<hgh);
      kz = prt[lw];
      u = key-prt[lw]; if(u<0.0) u = -u;
      h = lw;
      if(lw>0) {
        v = key-prt[lw-1]; if(v<0.0) v = -v;
        if(v<u) {
          u = v;
          h = lw-1;
        }
      }
      if(lw<n-1) {
        v = key-prt[lw+1]; if(v<0.0) v = -v;
        if(v<u) {
          u = v;
          h = lw+1;
        }
      }
      return h ;
      }